

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

void mpack_start_bin(mpack_writer_t *writer,uint32_t count)

{
  char *pcVar1;
  _Bool _Var2;
  uint8_t *u;
  ulong uVar3;
  
  if (mpack_version_v4 < writer->version) {
    if (count < 0x100) {
      if ((1 < (ulong)((long)writer->end - (long)writer->current)) ||
         (_Var2 = mpack_writer_ensure(writer,2), _Var2)) {
        pcVar1 = writer->current;
        *pcVar1 = -0x3c;
        pcVar1[1] = (char)count;
        writer->current = writer->current + 2;
      }
    }
    else {
      uVar3 = (long)writer->end - (long)writer->current;
      if (count < 0x10000) {
        if ((2 < uVar3) || (_Var2 = mpack_writer_ensure(writer,3), _Var2)) {
          pcVar1 = writer->current;
          *pcVar1 = -0x3b;
          *(ushort *)(pcVar1 + 1) = (ushort)count << 8 | (ushort)count >> 8;
          writer->current = writer->current + 3;
        }
      }
      else if ((4 < uVar3) || (_Var2 = mpack_writer_ensure(writer,5), _Var2)) {
        pcVar1 = writer->current;
        *pcVar1 = -0x3a;
        *(uint32_t *)(pcVar1 + 1) =
             count >> 0x18 | (count & 0xff0000) >> 8 | (count & 0xff00) << 8 | count << 0x18;
        writer->current = writer->current + 5;
      }
    }
    return;
  }
  mpack_start_str_notrack(writer,count);
  return;
}

Assistant:

void mpack_start_bin(mpack_writer_t* writer, uint32_t count) {
    mpack_writer_track_element(writer);
    mpack_start_bin_notrack(writer, count);
    mpack_writer_track_push(writer, mpack_type_bin, count);
}